

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O0

bool __thiscall SM_Manager::isValidAttrType(SM_Manager *this,AttrInfo attribute)

{
  int length;
  AttrType type;
  SM_Manager *this_local;
  AttrInfo attribute_local;
  
  attribute_local.attrName._0_4_ = attribute.attrType;
  attribute_local.attrName._4_4_ = attribute.attrLength;
  if (((AttrType)attribute_local.attrName == INT) && (attribute_local.attrName._4_4_ == 4)) {
    attribute_local.attrLength._3_1_ = true;
  }
  else if (((AttrType)attribute_local.attrName == FLOAT) && (attribute_local.attrName._4_4_ == 4)) {
    attribute_local.attrLength._3_1_ = true;
  }
  else if ((((AttrType)attribute_local.attrName == STRING) && (0 < attribute_local.attrName._4_4_))
          && (attribute_local.attrName._4_4_ < 0xff)) {
    attribute_local.attrLength._3_1_ = true;
  }
  else {
    attribute_local.attrLength._3_1_ = false;
  }
  return attribute_local.attrLength._3_1_;
}

Assistant:

bool SM_Manager::isValidAttrType(AttrInfo attribute){

  AttrType type = attribute.attrType;
  int length = attribute.attrLength;
  if(type == INT && length == 4)
    return true;
  if(type == FLOAT && length == 4)
    return true;
  if(type == STRING && (length > 0) && length < MAXSTRINGLEN)
    return true;

  return false;
}